

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::KHRDebug::APIErrorsTest::iterate(APIErrorsTest *this)

{
  glDebugMessageInsertFunc p_Var1;
  glPushDebugGroupFunc p_Var2;
  glObjectLabelFunc p_Var3;
  glObjectPtrLabelFunc p_Var4;
  GLsync p_Var5;
  GLboolean GVar6;
  GLenum GVar7;
  reference pvVar8;
  TestContext *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  TestError *pTVar12;
  EVP_PKEY_CTX *in_RSI;
  Enum<int,_2UL> EVar13;
  Enum<int,_2UL> local_39a8;
  GetNameFunc local_3998;
  int local_3990;
  Enum<int,_2UL> local_3988;
  int local_3974;
  MessageBuilder local_3970;
  GLenum local_37ec;
  void *pvStack_37e8;
  GLenum generated_error_30;
  GLuint *uint_ptr;
  GLuint uint;
  exception *exc_3;
  int local_37c8;
  Enum<int,_2UL> local_37c0;
  GetNameFunc local_37b0;
  int local_37a8;
  Enum<int,_2UL> local_37a0;
  int local_378c;
  MessageBuilder local_3788;
  GLenum local_3604;
  GetNameFunc p_Stack_3600;
  GLenum generated_error_29;
  int local_35f8;
  Enum<int,_2UL> local_35f0;
  GetNameFunc local_35e0;
  int local_35d8;
  Enum<int,_2UL> local_35d0;
  int local_35bc;
  MessageBuilder local_35b8;
  GLenum local_3434;
  GLsync p_Stack_3430;
  GLenum generated_error_28;
  GLsync invalid_id_3;
  GLsync sync_id_1;
  GLchar local_3418 [4];
  GLsizei length_5;
  GLchar label_3 [32];
  exception *exc_2;
  Enum<int,_2UL> local_33d8;
  GetNameFunc local_33c8;
  int local_33c0;
  Enum<int,_2UL> local_33b8;
  int local_33a4;
  MessageBuilder local_33a0;
  GLenum local_321c;
  GetNameFunc p_Stack_3218;
  GLenum generated_error_27;
  int local_3210;
  Enum<int,_2UL> local_3208;
  GetNameFunc local_31f8;
  int local_31f0;
  Enum<int,_2UL> local_31e8;
  int local_31d4;
  MessageBuilder local_31d0;
  GLenum local_304c;
  GetNameFunc p_Stack_3048;
  GLenum generated_error_26;
  int local_3040;
  Enum<int,_2UL> local_3038;
  GetNameFunc local_3028;
  int local_3020;
  Enum<int,_2UL> local_3018;
  int local_3004;
  MessageBuilder local_3000;
  GLenum local_2e7c;
  GLsync p_Stack_2e78;
  GLenum generated_error_25;
  GLsync invalid_id_2;
  GLsync sync_id;
  exception *exc_1;
  int local_2e58;
  Enum<int,_2UL> local_2e50;
  GetNameFunc local_2e40;
  int local_2e38;
  Enum<int,_2UL> local_2e30;
  int local_2e1c;
  MessageBuilder local_2e18;
  GLenum local_2c94;
  GetNameFunc p_Stack_2c90;
  GLenum generated_error_24;
  int local_2c88;
  Enum<int,_2UL> local_2c80;
  GetNameFunc local_2c70;
  int local_2c68;
  Enum<int,_2UL> local_2c60;
  int local_2c4c;
  MessageBuilder local_2c48;
  GLenum local_2ac4;
  GetNameFunc p_Stack_2ac0;
  GLenum generated_error_23;
  int local_2ab8;
  Enum<int,_2UL> local_2ab0;
  GetNameFunc local_2aa0;
  int local_2a98;
  Enum<int,_2UL> local_2a90;
  int local_2a7c;
  MessageBuilder local_2a78;
  GLenum local_28f8;
  GLuint local_28f4;
  GLenum generated_error_22;
  GLuint invalid_id_1;
  GLuint texture_id_1;
  GLsizei length_4;
  GLchar label_2 [32];
  exception *exc;
  Enum<int,_2UL> local_28b0;
  GetNameFunc local_28a0;
  int local_2898;
  Enum<int,_2UL> local_2890;
  int local_287c;
  MessageBuilder local_2878;
  GLenum local_26f4;
  GetNameFunc p_Stack_26f0;
  GLenum generated_error_21;
  int local_26e8;
  Enum<int,_2UL> local_26e0;
  GetNameFunc local_26d0;
  int local_26c8;
  Enum<int,_2UL> local_26c0;
  int local_26ac;
  MessageBuilder local_26a8;
  GLenum local_2524;
  GetNameFunc p_Stack_2520;
  GLenum generated_error_20;
  int local_2518;
  Enum<int,_2UL> local_2510;
  GetNameFunc local_2500;
  int local_24f8;
  Enum<int,_2UL> local_24f0;
  int local_24dc;
  MessageBuilder local_24d8;
  GLenum local_2354;
  GetNameFunc p_Stack_2350;
  GLenum generated_error_19;
  int local_2348;
  Enum<int,_2UL> local_2340;
  GetNameFunc local_2330;
  int local_2328;
  Enum<int,_2UL> local_2320;
  int local_230c;
  MessageBuilder local_2308;
  GLenum local_2184;
  GLuint local_2180;
  GLenum generated_error_18;
  GLuint invalid_id;
  GLuint texture_id;
  int local_2170;
  Enum<int,_2UL> local_2168;
  GetNameFunc local_2158;
  int local_2150;
  Enum<int,_2UL> local_2148;
  int local_2134;
  MessageBuilder local_2130;
  GLenum local_1fb0;
  int local_1fac;
  GLenum generated_error_17;
  GLint i_3;
  int local_1fa0;
  Enum<int,_2UL> local_1f98;
  GetNameFunc local_1f88;
  int local_1f80;
  Enum<int,_2UL> local_1f78;
  int local_1f64;
  MessageBuilder local_1f60;
  GLenum local_1de0;
  int local_1ddc;
  GLenum generated_error_16;
  GLint i_2;
  int local_1dd0;
  Enum<int,_2UL> local_1dc8;
  GetNameFunc local_1db8;
  int local_1db0;
  Enum<int,_2UL> local_1da8;
  int local_1d94;
  MessageBuilder local_1d90;
  GLenum local_1c0c;
  GetNameFunc p_Stack_1c08;
  GLenum generated_error_15;
  int local_1c00;
  Enum<int,_2UL> local_1bf8;
  GetNameFunc local_1be8;
  int local_1be0;
  Enum<int,_2UL> local_1bd8;
  int local_1bc4;
  MessageBuilder local_1bc0;
  GLenum local_1a3c;
  GetNameFunc p_Stack_1a38;
  GLenum generated_error_14;
  int local_1a30;
  Enum<int,_2UL> local_1a28;
  GetNameFunc local_1a18;
  int local_1a10;
  Enum<int,_2UL> local_1a08;
  int local_19f4;
  MessageBuilder local_19f0;
  GLenum local_186c;
  GetNameFunc p_Stack_1868;
  GLenum generated_error_13;
  int local_1860;
  Enum<int,_2UL> local_1858;
  GetNameFunc local_1848;
  int local_1840;
  Enum<int,_2UL> local_1838;
  int local_1824;
  MessageBuilder local_1820;
  GLenum local_169c;
  GetNameFunc p_Stack_1698;
  GLenum generated_error_12;
  int local_1690;
  Enum<int,_2UL> local_1688;
  GetNameFunc local_1678;
  int local_1670;
  Enum<int,_2UL> local_1668;
  int local_1654;
  MessageBuilder local_1650;
  GLenum local_14cc;
  GetNameFunc p_Stack_14c8;
  GLenum generated_error_11;
  int local_14c0;
  Enum<int,_2UL> local_14b8;
  GetNameFunc local_14a8;
  int local_14a0;
  Enum<int,_2UL> local_1498;
  int local_1484;
  MessageBuilder local_1480;
  GLenum local_12fc;
  GetNameFunc p_Stack_12f8;
  GLenum generated_error_10;
  int local_12f0;
  Enum<int,_2UL> local_12e8;
  GetNameFunc local_12d8;
  int local_12d0;
  Enum<int,_2UL> local_12c8;
  int local_12b4;
  MessageBuilder local_12b0;
  GLenum local_112c;
  GetNameFunc p_Stack_1128;
  GLenum generated_error_9;
  int local_1120;
  Enum<int,_2UL> local_1118;
  GetNameFunc local_1108;
  int local_1100;
  Enum<int,_2UL> local_10f8;
  int local_10e4;
  MessageBuilder local_10e0;
  GLenum local_f5c;
  GetNameFunc p_Stack_f58;
  GLenum generated_error_8;
  int local_f50;
  Enum<int,_2UL> local_f48;
  GetNameFunc local_f38;
  int local_f30;
  Enum<int,_2UL> local_f28;
  int local_f14;
  MessageBuilder local_f10;
  GLenum local_d8c;
  GLenum local_d88;
  GLenum generated_error_7;
  GLenum sources [4];
  GLenum severities [4];
  GLenum types [4];
  GLchar messageLog [32];
  GLsizei lengths [4];
  GLenum ids_1 [4];
  Enum<int,_2UL> local_d08;
  GetNameFunc local_cf8;
  int local_cf0;
  Enum<int,_2UL> local_ce8;
  int local_cd4;
  MessageBuilder local_cd0;
  GLenum local_b4c;
  GetNameFunc p_Stack_b48;
  GLenum generated_error_6;
  int local_b40;
  Enum<int,_2UL> local_b38;
  GetNameFunc local_b28;
  int local_b20;
  Enum<int,_2UL> local_b18;
  int local_b04;
  MessageBuilder local_b00;
  GLenum local_97c;
  GetNameFunc p_Stack_978;
  GLenum generated_error_5;
  int local_970;
  Enum<int,_2UL> local_968;
  GetNameFunc local_958;
  int local_950;
  Enum<int,_2UL> local_948;
  int local_934;
  MessageBuilder local_930;
  GLenum local_7ac;
  GetNameFunc p_Stack_7a8;
  GLenum generated_error_4;
  int local_7a0;
  Enum<int,_2UL> local_798;
  GetNameFunc local_788;
  int local_780;
  Enum<int,_2UL> local_778;
  int local_764;
  MessageBuilder local_760;
  GLenum local_5dc;
  GetNameFunc p_Stack_5d8;
  GLenum generated_error_3;
  int local_5d0;
  Enum<int,_2UL> local_5c8;
  GetNameFunc local_5b8;
  int local_5b0;
  Enum<int,_2UL> local_5a8;
  int local_594;
  MessageBuilder local_590;
  GLenum local_40c;
  GetNameFunc p_Stack_408;
  GLenum generated_error_2;
  int local_400;
  Enum<int,_2UL> local_3f8;
  GetNameFunc local_3e8;
  int local_3e0;
  Enum<int,_2UL> local_3d8;
  int local_3c4;
  MessageBuilder local_3c0;
  GLenum local_23c;
  GetNameFunc p_Stack_238;
  GLenum generated_error_1;
  int local_230;
  Enum<int,_2UL> local_228;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  int local_1f4;
  MessageBuilder local_1f0;
  GLenum local_6c;
  GLint local_68;
  GLenum generated_error;
  GLint max_groups;
  GLint i_1;
  vector<char,_std::allocator<char>_> too_long_message;
  int local_40;
  GLint max_length;
  GLint i;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> too_long_label;
  GLint max_label;
  APIErrorsTest *this_local;
  
  TestBase::init(&this->super_TestBase,in_RSI);
  too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)
            (0x82e8,(GLint *)&too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .field_0x14);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0xfb);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_30);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_30,
             (long)(too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ +
                   2));
  for (local_40 = 0;
      local_40 <= (int)too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_
      ; local_40 = local_40 + 1) {
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,(long)local_40);
    *pvVar8 = 'f';
  }
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,
                      (long)(too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             _20_4_ + 1));
  *pvVar8 = '\0';
  too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)
            (0x9143,(GLint *)&too_long_message.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.field_0x14);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x10d);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&max_groups);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&max_groups,
             (long)(too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_
                   + 2));
  for (generated_error = 0;
      (int)generated_error <=
      (int)too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
      generated_error = generated_error + 1) {
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&max_groups,
                        (long)(int)generated_error);
    *pvVar8 = 'f';
  }
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&max_groups,
                      (long)(too_long_message.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl._20_4_ + 1));
  *pvVar8 = '\0';
  local_68 = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)(0x826c,&local_68);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x11f);
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8892,0x824c,0x9148,0,(GLuint *)0x0,'\x01')
  ;
  local_6c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_6c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1f0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1f4 = 0x133;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1f4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_6c);
    local_218 = EVar13.m_getName;
    local_210 = EVar13.m_value;
    local_208.m_getName = local_218;
    local_208.m_value = local_210;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_208);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_238 = EVar13.m_getName;
    local_230 = EVar13.m_value;
    local_228.m_getName = p_Stack_238;
    local_228.m_value = local_230;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_228);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [57])
                                 "DebugMessageControl with <source> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x133);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x8892,0x9148,0,(GLuint *)0x0,'\x01')
  ;
  local_23c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_23c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_3c0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_3c4 = 0x138;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3c4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_23c);
    local_3e8 = EVar13.m_getName;
    local_3e0 = EVar13.m_value;
    local_3d8.m_getName = local_3e8;
    local_3d8.m_value = local_3e0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3d8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_408 = EVar13.m_getName;
    local_400 = EVar13.m_value;
    local_3f8.m_getName = p_Stack_408;
    local_3f8.m_value = local_400;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3f8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [55])
                                 "DebugMessageControl with <type> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x138);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x8892,0,(GLuint *)0x0,'\x01')
  ;
  local_40c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_40c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_590,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_590,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_594 = 0x13c;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_594);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_40c);
    local_5b8 = EVar13.m_getName;
    local_5b0 = EVar13.m_value;
    local_5a8.m_getName = local_5b8;
    local_5a8.m_value = local_5b0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5a8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_5d8 = EVar13.m_getName;
    local_5d0 = EVar13.m_value;
    local_5c8.m_getName = p_Stack_5d8;
    local_5c8.m_value = local_5d0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5c8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [59])
                                 "DebugMessageControl with <severity> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_590);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x13c);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x9148,-1,iterate::ids,'\x01')
  ;
  local_5dc = (*((this->super_TestBase).m_gl)->getError)();
  if (local_5dc != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_760,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_760,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_764 = 0x141;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_764);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_5dc);
    local_788 = EVar13.m_getName;
    local_780 = EVar13.m_value;
    local_778.m_getName = local_788;
    local_778.m_value = local_780;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_778);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_7a8 = EVar13.m_getName;
    local_7a0 = EVar13.m_value;
    local_798.m_getName = p_Stack_7a8;
    local_798.m_value = local_7a0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_798);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [43])"DebugMessageControl with <count> set to -1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_760);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x141);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x1100,0x824c,0x1100,9,iterate::ids,'\x01');
  local_7ac = (*((this->super_TestBase).m_gl)->getError)();
  if (local_7ac != 0x502) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_930,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_930,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_934 = 0x145;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_934);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_7ac);
    local_958 = EVar13.m_getName;
    local_950 = EVar13.m_value;
    local_948.m_getName = local_958;
    local_948.m_value = local_950;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_948);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x502);
    p_Stack_978 = EVar13.m_getName;
    local_970 = EVar13.m_value;
    local_968.m_getName = p_Stack_978;
    local_968.m_value = local_970;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_968);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [75])
                                 "DebugMessageControl with <source> set to GL_DONT_CARE and non zero <count>"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_930);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x145);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x1100,0x1100,9,iterate::ids,'\x01');
  local_97c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_97c != 0x502) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_b00,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_b00,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_b04 = 0x149;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_b04);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_97c);
    local_b28 = EVar13.m_getName;
    local_b20 = EVar13.m_value;
    local_b18.m_getName = local_b28;
    local_b18.m_value = local_b20;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_b18);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x502);
    p_Stack_b48 = EVar13.m_getName;
    local_b40 = EVar13.m_value;
    local_b38.m_getName = p_Stack_b48;
    local_b38.m_value = local_b40;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_b38);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [73])
                                 "DebugMessageControl with <type> set to GL_DONT_CARE and non zero <count>"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b00);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x149);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x9148,9,iterate::ids,'\x01');
  local_b4c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_b4c != 0x502) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_cd0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_cd0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_cd4 = 0x14f;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_cd4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_b4c);
    local_cf8 = EVar13.m_getName;
    local_cf0 = EVar13.m_value;
    local_ce8.m_getName = local_cf8;
    local_ce8.m_value = local_cf0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ce8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x502);
    local_d08.m_getName = EVar13.m_getName;
    local_d08.m_value = EVar13.m_value;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_d08);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [86])
                                 "DebugMessageControl with <severity> set to GL_DEBUG_SEVERITY_LOW and non zero <count>"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_cd0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x14f);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->getDebugMessageLog)
            (4,-1,&local_d88,severities + 2,(GLuint *)(lengths + 2),sources + 2,
             (GLsizei *)(messageLog + 0x18),(GLchar *)(types + 2));
  local_d8c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_d8c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_f10,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_f10,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_f14 = 0x163;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_f14);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_d8c);
    local_f38 = EVar13.m_getName;
    local_f30 = EVar13.m_value;
    local_f28.m_getName = local_f38;
    local_f28.m_value = local_f30;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_f28);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_f58 = EVar13.m_getName;
    local_f50 = EVar13.m_value;
    local_f48.m_getName = p_Stack_f58;
    local_f48.m_value = local_f50;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_f48);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [44])"GetDebugMessageLog with <bufSize> set to -1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_f10);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x163);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x8246,0x824d,0,0x9148,4,"Foo");
  local_f5c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_f5c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_10e0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_10e0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_10e4 = 0x176;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_10e4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_f5c);
    local_1108 = EVar13.m_getName;
    local_1100 = EVar13.m_value;
    local_10f8.m_getName = local_1108;
    local_10f8.m_value = local_1100;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_10f8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_1128 = EVar13.m_getName;
    local_1120 = EVar13.m_value;
    local_1118.m_getName = p_Stack_1128;
    local_1118.m_value = local_1120;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1118);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [60])
                                 "DebugMessageInsert with <source> set to GL_DEBUG_SOURCE_API");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_10e0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x176);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x824a,0x8892,0,0x9148,4,"Foo");
  local_112c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_112c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_12b0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_12b0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_12b4 = 0x17a;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_12b4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_112c);
    local_12d8 = EVar13.m_getName;
    local_12d0 = EVar13.m_value;
    local_12c8.m_getName = local_12d8;
    local_12c8.m_value = local_12d0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_12c8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_12f8 = EVar13.m_getName;
    local_12f0 = EVar13.m_value;
    local_12e8.m_getName = p_Stack_12f8;
    local_12e8.m_value = local_12f0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_12e8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [54])
                                 "DebugMessageInsert with <type> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_12b0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x17a);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x824a,0x824d,0,0x8892,4,"Foo");
  local_12fc = (*((this->super_TestBase).m_gl)->getError)();
  if (local_12fc != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1480,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1480,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1484 = 0x17f;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1484);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_12fc);
    local_14a8 = EVar13.m_getName;
    local_14a0 = EVar13.m_value;
    local_1498.m_getName = local_14a8;
    local_1498.m_value = local_14a0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1498);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_14c8 = EVar13.m_getName;
    local_14c0 = EVar13.m_value;
    local_14b8.m_getName = p_Stack_14c8;
    local_14b8.m_value = local_14c0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_14b8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [58])
                                 "DebugMessageInsert with <severity> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1480);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x17f);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)
            (0x824a,0x824d,0,0x9148,
             too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1,
             "Foo");
  local_14cc = (*((this->super_TestBase).m_gl)->getError)();
  if (local_14cc != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1650,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1650,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1654 = 0x184;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1654);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_14cc);
    local_1678 = EVar13.m_getName;
    local_1670 = EVar13.m_value;
    local_1668.m_getName = local_1678;
    local_1668.m_value = local_1670;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1668);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_1698 = EVar13.m_getName;
    local_1690 = EVar13.m_value;
    local_1688.m_getName = p_Stack_1698;
    local_1688.m_value = local_1690;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1688);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [72])
                                 "DebugMessageInsert with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1650);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x184);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var1 = ((this->super_TestBase).m_gl)->debugMessageInsert;
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&max_groups,0);
  (*p_Var1)(0x824a,0x824d,0,0x9148,-1,pvVar8);
  local_169c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_169c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1820,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1820,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1824 = 0x189;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1824);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_169c);
    local_1848 = EVar13.m_getName;
    local_1840 = EVar13.m_value;
    local_1838.m_getName = local_1848;
    local_1838.m_value = local_1840;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1838);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_1868 = EVar13.m_getName;
    local_1860 = EVar13.m_value;
    local_1858.m_getName = p_Stack_1868;
    local_1858.m_value = local_1860;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1858);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [41])"DebugMessageInsert with too long message");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1820);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x189);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x8246,1,4,"Foo");
  local_186c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_186c != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_19f0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_19f0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_19f4 = 0x199;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_19f4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_186c);
    local_1a18 = EVar13.m_getName;
    local_1a10 = EVar13.m_value;
    local_1a08.m_getName = local_1a18;
    local_1a08.m_value = local_1a10;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1a08);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_1a38 = EVar13.m_getName;
    local_1a30 = EVar13.m_value;
    local_1a28.m_getName = p_Stack_1a38;
    local_1a28.m_value = local_1a30;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1a28);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [56])
                                 "PushDebugGroup with <source> set to GL_DEBUG_SOURCE_API");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_19f0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x199);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->pushDebugGroup)
            (0x824a,1,too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      _20_4_ + 1,"Foo");
  local_1a3c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_1a3c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1bc0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1bc0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1bc4 = 0x19d;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1bc4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_1a3c);
    local_1be8 = EVar13.m_getName;
    local_1be0 = EVar13.m_value;
    local_1bd8.m_getName = local_1be8;
    local_1bd8.m_value = local_1be0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1bd8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_1c08 = EVar13.m_getName;
    local_1c00 = EVar13.m_value;
    local_1bf8.m_getName = p_Stack_1c08;
    local_1bf8.m_value = local_1c00;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1bf8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [68])
                                 "PushDebugGroup with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1bc0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x19d);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var2 = ((this->super_TestBase).m_gl)->pushDebugGroup;
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&max_groups,0);
  (*p_Var2)(0x824a,1,-1,pvVar8);
  local_1c0c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_1c0c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1d90,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1d90,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1d94 = 0x1a1;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1d94);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_1c0c);
    local_1db8 = EVar13.m_getName;
    local_1db0 = EVar13.m_value;
    local_1da8.m_getName = local_1db8;
    local_1da8.m_value = local_1db0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1da8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    _generated_error_16 = EVar13.m_getName;
    local_1dd0 = EVar13.m_value;
    local_1dc8.m_getName = _generated_error_16;
    local_1dc8.m_value = local_1dd0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1dc8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [37])"PushDebugGroup with too long message");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d90);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1a1);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  cleanGroupStack((this->super_TestBase).m_gl);
  for (local_1ddc = 0; local_1ddc < local_68 + -1; local_1ddc = local_1ddc + 1) {
    (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x824a,1,4,"Foo");
    GVar7 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar7,"PushDebugGroup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x1ab);
  }
  (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x824a,1,4,"Foo");
  local_1de0 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_1de0 != 0x503) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_1f60,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_1f60,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_1f64 = 0x1b1;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1f64);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_1de0);
    local_1f88 = EVar13.m_getName;
    local_1f80 = EVar13.m_value;
    local_1f78.m_getName = local_1f88;
    local_1f78.m_value = local_1f80;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1f78);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x503);
    _generated_error_17 = EVar13.m_getName;
    local_1fa0 = EVar13.m_value;
    local_1f98.m_getName = _generated_error_17;
    local_1f98.m_value = local_1fa0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_1f98);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [59])
                                 "PushDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f60);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1b1);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  cleanGroupStack((this->super_TestBase).m_gl);
  fillGroupStack((this->super_TestBase).m_gl);
  for (local_1fac = 0; local_1fac < local_68 + -1; local_1fac = local_1fac + 1) {
    (*((this->super_TestBase).m_gl)->popDebugGroup)();
    GVar7 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar7,"PopDebugGroup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x1c2);
  }
  (*((this->super_TestBase).m_gl)->popDebugGroup)();
  local_1fb0 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_1fb0 != 0x504) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2130,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2130,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_2134 = 0x1c6;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2134);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_1fb0);
    local_2158 = EVar13.m_getName;
    local_2150 = EVar13.m_value;
    local_2148.m_getName = local_2158;
    local_2148.m_value = local_2150;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2148);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x504);
    _invalid_id = EVar13.m_getName;
    local_2170 = EVar13.m_value;
    local_2168.m_getName = _invalid_id;
    local_2168.m_value = local_2170;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2168);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [58])
                                 "PopDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2130);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1c6);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  generated_error_18 = 0;
  local_2180 = 1;
  (*((this->super_TestBase).m_gl)->genTextures)(1,&generated_error_18);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x1d8);
  (*((this->super_TestBase).m_gl)->objectLabel)(0x8c2a,generated_error_18,4,"Foo");
  local_2184 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_2184 != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2308,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2308,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_230c = 0x1de;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_230c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2184);
    local_2330 = EVar13.m_getName;
    local_2328 = EVar13.m_value;
    local_2320.m_getName = local_2330;
    local_2320.m_value = local_2328;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2320);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_2350 = EVar13.m_getName;
    local_2348 = EVar13.m_value;
    local_2340.m_getName = p_Stack_2350;
    local_2340.m_value = local_2348;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2340);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [55])0x29c56c6);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2308);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1de);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_2184 = 0x500;
  while( true ) {
    GVar6 = (*((this->super_TestBase).m_gl)->isTexture)(local_2180);
    if (GVar6 != '\x01') break;
    local_2180 = local_2180 + 1;
  }
  (*((this->super_TestBase).m_gl)->objectLabel)(0x1702,local_2180,4,"Foo");
  local_2354 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_2354 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_24d8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_24d8,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_24dc = 0x1e7;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_24dc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2354);
    local_2500 = EVar13.m_getName;
    local_24f8 = EVar13.m_value;
    local_24f0.m_getName = local_2500;
    local_24f0.m_value = local_24f8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_24f0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_2520 = EVar13.m_getName;
    local_2518 = EVar13.m_value;
    local_2510.m_getName = p_Stack_2520;
    local_2510.m_value = local_2518;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2510);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [51])0x29c5700);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_24d8);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1e7);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->objectLabel)
            (0x1702,generated_error_18,
             too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1,"Foo"
            );
  local_2524 = (*((this->super_TestBase).m_gl)->getError)();
  GVar7 = generated_error_18;
  if (local_2524 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_26a8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_26a8,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_26ac = 0x1eb;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_26ac);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2524);
    local_26d0 = EVar13.m_getName;
    local_26c8 = EVar13.m_value;
    local_26c0.m_getName = local_26d0;
    local_26c0.m_value = local_26c8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_26c0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_26f0 = EVar13.m_getName;
    local_26e8 = EVar13.m_value;
    local_26e0.m_getName = p_Stack_26f0;
    local_26e0.m_value = local_26e8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_26e0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [53])
                                 "ObjectLabel with <label> set to MAX_LABEL_LENGTH + 1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_26a8);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1eb);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var3 = ((this->super_TestBase).m_gl)->objectLabel;
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,0);
  (*p_Var3)(0x1702,GVar7,-1,pvVar8);
  local_26f4 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_26f4 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2878,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2878,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_287c = 0x1ef;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_287c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_26f4);
    local_28a0 = EVar13.m_getName;
    local_2898 = EVar13.m_value;
    local_2890.m_getName = local_28a0;
    local_2890.m_value = local_2898;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2890);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    local_28b0.m_getName = EVar13.m_getName;
    local_28b0.m_value = EVar13.m_value;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_28b0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [32])"ObjectLabel with too long label");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2878);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x1ef);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->deleteTextures)(1,&generated_error_18);
  invalid_id_1 = 0;
  generated_error_22 = 0;
  local_28f4 = 1;
  (*((this->super_TestBase).m_gl)->genTextures)(1,&generated_error_22);
  (*((this->super_TestBase).m_gl)->bindTexture)(0xde1,generated_error_22);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x20b);
  (*((this->super_TestBase).m_gl)->getObjectLabel)
            (0x8c2a,generated_error_22,0x20,(GLsizei *)&invalid_id_1,(GLchar *)&texture_id_1);
  local_28f8 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_28f8 != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2a78,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2a78,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_2a7c = 0x211;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2a7c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_28f8);
    local_2aa0 = EVar13.m_getName;
    local_2a98 = EVar13.m_value;
    local_2a90.m_getName = local_2aa0;
    local_2a90.m_value = local_2a98;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2a90);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    p_Stack_2ac0 = EVar13.m_getName;
    local_2ab8 = EVar13.m_value;
    local_2ab0.m_getName = p_Stack_2ac0;
    local_2ab0.m_value = local_2ab8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2ab0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [58])
                                 "GetObjectLabel with <identifier> set to GL_TEXTURE_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2a78);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x211);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_28f8 = 0x500;
  while( true ) {
    GVar6 = (*((this->super_TestBase).m_gl)->isTexture)(local_28f4);
    if (GVar6 != '\x01') break;
    local_28f4 = local_28f4 + 1;
  }
  (*((this->super_TestBase).m_gl)->getObjectLabel)
            (0x1702,local_28f4,0x20,(GLsizei *)&invalid_id_1,(GLchar *)&texture_id_1);
  local_2ac4 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_2ac4 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2c48,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2c48,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_2c4c = 0x21a;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c4c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2ac4);
    local_2c70 = EVar13.m_getName;
    local_2c68 = EVar13.m_value;
    local_2c60.m_getName = local_2c70;
    local_2c60.m_value = local_2c68;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c60);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_2c90 = EVar13.m_getName;
    local_2c88 = EVar13.m_value;
    local_2c80.m_getName = p_Stack_2c90;
    local_2c80.m_value = local_2c88;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c80);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [54])
                                 "GetObjectLabel with <name> set to not generated value");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2c48);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x21a);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->getObjectLabel)
            (0x1702,local_28f4,-1,(GLsizei *)&invalid_id_1,(GLchar *)&texture_id_1);
  local_2c94 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_2c94 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_2e18,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_2e18,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_2e1c = 0x21e;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2e1c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2c94);
    local_2e40 = EVar13.m_getName;
    local_2e38 = EVar13.m_value;
    local_2e30.m_getName = local_2e40;
    local_2e30.m_value = local_2e38;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2e30);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    exc_1 = (exception *)EVar13.m_getName;
    local_2e58 = EVar13.m_value;
    local_2e50.m_getName = (GetNameFunc)exc_1;
    local_2e50.m_value = local_2e58;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2e50);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [40])"GetObjectLabel with <bufSize> set to -1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e18);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x21e);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->deleteTextures)(1,&generated_error_22);
  invalid_id_2 = (GLsync)0x0;
  p_Stack_2e78 = (GLsync)0x0;
  invalid_id_2 = (*((this->super_TestBase).m_gl)->fenceSync)(0x9117,0);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"FenceSync",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x236);
  while( true ) {
    GVar6 = (*((this->super_TestBase).m_gl)->isSync)(p_Stack_2e78);
    if (GVar6 != '\x01') break;
    p_Stack_2e78 = p_Stack_2e78 + 1;
  }
  (*((this->super_TestBase).m_gl)->objectPtrLabel)(p_Stack_2e78,4,"Foo");
  local_2e7c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_2e7c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_3000,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_3000,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_3004 = 0x240;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3004);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_2e7c);
    local_3028 = EVar13.m_getName;
    local_3020 = EVar13.m_value;
    local_3018.m_getName = local_3028;
    local_3018.m_value = local_3020;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3018);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_3048 = EVar13.m_getName;
    local_3040 = EVar13.m_value;
    local_3038.m_getName = p_Stack_3048;
    local_3038.m_value = local_3040;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3038);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [53])0x29c57ba);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3000);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x240);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->objectPtrLabel)
            (invalid_id_2,
             too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1,"Foo"
            );
  local_304c = (*((this->super_TestBase).m_gl)->getError)();
  p_Var5 = invalid_id_2;
  if (local_304c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_31d0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_31d0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_31d4 = 0x243;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_31d4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_304c);
    local_31f8 = EVar13.m_getName;
    local_31f0 = EVar13.m_value;
    local_31e8.m_getName = local_31f8;
    local_31e8.m_value = local_31f0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_31e8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_3218 = EVar13.m_getName;
    local_3210 = EVar13.m_value;
    local_3208.m_getName = p_Stack_3218;
    local_3208.m_value = local_3210;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3208);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [57])
                                 "ObjectPtrLabel with <length> set to MAX_LABEL_LENGTH + 1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_31d0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x243);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var4 = ((this->super_TestBase).m_gl)->objectPtrLabel;
  pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,0);
  (*p_Var4)(p_Var5,-1,pvVar8);
  local_321c = (*((this->super_TestBase).m_gl)->getError)();
  if (local_321c != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_33a0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_33a0,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_33a4 = 0x246;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_33a4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_321c);
    local_33c8 = EVar13.m_getName;
    local_33c0 = EVar13.m_value;
    local_33b8.m_getName = local_33c8;
    local_33b8.m_value = local_33c0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_33b8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    local_33d8.m_getName = EVar13.m_getName;
    local_33d8.m_value = EVar13.m_value;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_33d8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [35])"ObjectPtrLabel with too long label");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_33a0);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x246);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->deleteSync)(invalid_id_2);
  sync_id_1._4_4_ = 0;
  invalid_id_3 = (GLsync)0x0;
  p_Stack_3430 = (GLsync)0x0;
  invalid_id_3 = (*((this->super_TestBase).m_gl)->fenceSync)(0x9117,0);
  GVar7 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar7,"FenceSync",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x25f);
  while( true ) {
    GVar6 = (*((this->super_TestBase).m_gl)->isSync)(p_Stack_3430);
    if (GVar6 != '\x01') break;
    p_Stack_3430 = p_Stack_3430 + 1;
  }
  (*((this->super_TestBase).m_gl)->getObjectPtrLabel)
            (p_Stack_3430,0x20,(GLsizei *)((long)&sync_id_1 + 4),local_3418);
  local_3434 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_3434 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_35b8,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_35b8,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_35bc = 0x26a;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_35bc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_3434);
    local_35e0 = EVar13.m_getName;
    local_35d8 = EVar13.m_value;
    local_35d0.m_getName = local_35e0;
    local_35d0.m_value = local_35d8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_35d0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    p_Stack_3600 = EVar13.m_getName;
    local_35f8 = EVar13.m_value;
    local_35f0.m_getName = p_Stack_3600;
    local_35f0.m_value = local_35f8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_35f0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [56])
                                 "GetObjectPtrLabel with <ptr> set to not generated value");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_35b8);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x26a);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->getObjectPtrLabel)
            (invalid_id_3,-1,(GLsizei *)((long)&sync_id_1 + 4),local_3418);
  local_3604 = (*((this->super_TestBase).m_gl)->getError)();
  if (local_3604 != 0x501) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_3788,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_3788,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_378c = 0x26d;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_378c);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_3604);
    local_37b0 = EVar13.m_getName;
    local_37a8 = EVar13.m_value;
    local_37a0.m_getName = local_37b0;
    local_37a0.m_value = local_37a8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_37a0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x501);
    exc_3 = (exception *)EVar13.m_getName;
    local_37c8 = EVar13.m_value;
    local_37c0.m_getName = (GetNameFunc)exc_3;
    local_37c0.m_value = local_37c8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_37c0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [43])"GetObjectPtrLabel with <bufSize> set to -1");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3788);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x26d);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*((this->super_TestBase).m_gl)->deleteSync)(invalid_id_3);
  pvStack_37e8 = (void *)((long)&uint_ptr + 4);
  (*((this->super_TestBase).m_gl)->getPointerv)(0x8892,&stack0xffffffffffffc818);
  local_37ec = (*((this->super_TestBase).m_gl)->getError)();
  if (local_37ec != 0x500) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_3970,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_3970,(char (*) [7])0x2a28b75);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [127])
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])", line: ");
    local_3974 = 0x281;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3974);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Got wrong error: ");
    EVar13 = glu::getErrorStr(local_37ec);
    local_3998 = EVar13.m_getName;
    local_3990 = EVar13.m_value;
    local_3988.m_getName = local_3998;
    local_3988.m_value = local_3990;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3988);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2a14159);
    EVar13 = glu::getErrorStr(0x500);
    local_39a8.m_getName = EVar13.m_getName;
    local_39a8.m_value = EVar13.m_value;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_39a8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])", message: ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [48])"GetPointerv with <pname> set to GL_ARRAY_BUFFER");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3970);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x281);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(pTVar9,QP_TEST_RESULT_PASS,"Pass");
  TestBase::done(&this->super_TestBase);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&max_groups);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APIErrorsTest::iterate()
{
	/* Initialize rendering context */
	TestBase::init();

	/* Get maximum label length */
	GLint max_label = 0;

	m_gl->getIntegerv(GL_MAX_LABEL_LENGTH, &max_label);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/* Prepare too long label */
	std::vector<GLchar> too_long_label;

	too_long_label.resize(max_label + 2);

	for (GLint i = 0; i <= max_label; ++i)
	{
		too_long_label[i] = 'f';
	}

	too_long_label[max_label + 1] = 0;

	/* Get maximum message length */
	GLint max_length = 0;

	m_gl->getIntegerv(GL_MAX_DEBUG_MESSAGE_LENGTH, &max_length);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/* Prepare too long message */
	std::vector<GLchar> too_long_message;

	too_long_message.resize(max_length + 2);

	for (GLint i = 0; i <= max_length; ++i)
	{
		too_long_message[i] = 'f';
	}

	too_long_message[max_length + 1] = 0;

	/* Get maximum number of groups on stack */
	GLint max_groups = 0;

	m_gl->getIntegerv(GL_MAX_DEBUG_GROUP_STACK_DEPTH, &max_groups);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/*
	 * DebugMessageControl function should generate:
	 * - INVALID_ENUM when <source> is invalid;
	 * - INVALID_ENUM when <type> is invalid;
	 * - INVALID_ENUM when <severity> is invalid;
	 * - INVALID_VALUE when <count> is negative;
	 * - INVALID_OPERATION when <count> is not zero and <source> is DONT_CARE;
	 * - INVALID_OPERATION when <count> is not zero and <type> is DONT_CARE;
	 * - INVALID_OPERATION when <count> is not zero and <severity> is not
	 * DONT_CARE.
	 */
	{
		static const GLuint  ids[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8 };
		static const GLsizei n_ids = (GLsizei)(sizeof(ids) / sizeof(ids[0]));

		m_gl->debugMessageControl(GL_ARRAY_BUFFER /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, 0 /* count */, 0 /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <source> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_ARRAY_BUFFER /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, 0 /* count */, 0 /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <type> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_ARRAY_BUFFER /* severity */, 0 /* count */, 0 /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <severity> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, -1 /* count */, ids /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageControl with <count> set to -1");

		m_gl->debugMessageControl(GL_DONT_CARE /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DONT_CARE /* severity */, n_ids /* count */, ids /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION, "DebugMessageControl with <source> set to GL_DONT_CARE and non zero <count>");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DONT_CARE /* type */,
								  GL_DONT_CARE /* severity */, n_ids /* count */, ids /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION, "DebugMessageControl with <type> set to GL_DONT_CARE and non zero <count>");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, n_ids /* count */, ids /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION,
					"DebugMessageControl with <severity> set to GL_DEBUG_SEVERITY_LOW and non zero <count>");
	}

	/*
	 * GetDebugMessageLog function should generate:
	 * - INVALID_VALUE when <bufSize> is negative and messageLog is not NULL.
	 */
	{
		static const GLsizei bufSize = 32;
		static const GLuint  count   = 4;

		GLenum  ids[count];
		GLsizei lengths[count];
		GLchar  messageLog[bufSize];
		GLenum  types[count];
		GLenum  severities[count];
		GLenum  sources[count];

		m_gl->getDebugMessageLog(count /* count */, -1 /* bufSize */, sources, types, ids, severities, lengths,
								 messageLog);
		CHECK_ERROR(GL_INVALID_VALUE, "GetDebugMessageLog with <bufSize> set to -1");
	}

	/*
	 * DebugMessageInsert function should generate:
	 * - INVALID_ENUM when <source> is not DEBUG_SOURCE_APPLICATION or
	 * DEBUG_SOURCE_THIRD_PARTY;
	 * - INVALID_ENUM when <type> is invalid;
	 * - INVALID_ENUM when <severity> is invalid;
	 * - INVALID_VALUE when length of string <buf> is not less than
	 * MAX_DEBUG_MESSAGE_LENGTH.
	 */
	{
		static const GLchar  message[] = "Foo";
		static const GLsizei length	= (GLsizei)(sizeof(message) / sizeof(message[0]));

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, length /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <source> set to GL_DEBUG_SOURCE_API");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_ARRAY_BUFFER /* type */, 0 /* id */,
								 GL_DEBUG_SEVERITY_LOW /* severity */, length /* length */, message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <type> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_ARRAY_BUFFER /* severity */, length /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <severity> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, max_length + 1 /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageInsert with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, -1 /* length */,
								 &too_long_message[0] /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageInsert with too long message");
	}

	/*
	 * PushDebugGroup function should generate:
	 * - INVALID_ENUM when <source> is not DEBUG_SOURCE_APPLICATION or
	 * DEBUG_SOURCE_THIRD_PARTY;
	 * - INVALID_VALUE when length of string <message> is not less than
	 * MAX_DEBUG_MESSAGE_LENGTH;
	 * - STACK_OVERFLOW when stack contains MAX_DEBUG_GROUP_STACK_DEPTH entries.
	 */
	{
		static const GLchar  message[] = "Foo";
		static const GLsizei length	= (GLsizei)(sizeof(message) / sizeof(message[0]));

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_API /* source */, 1 /* id */, length /* length */, message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "PushDebugGroup with <source> set to GL_DEBUG_SOURCE_API");

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, max_length + 1 /* length */,
							 message /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "PushDebugGroup with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1");

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, -1 /* length */,
							 &too_long_message[0] /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "PushDebugGroup with too long message");

		/* Clean stack */
		cleanGroupStack(m_gl);

		/* Fill stack */
		for (GLint i = 0; i < max_groups - 1; ++i)
		{
			m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, length /* length */,
								 message /* message */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "PushDebugGroup");
		}

		/* Overflow stack */
		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, length /* length */,
							 message /* message */);
		CHECK_ERROR(GL_STACK_OVERFLOW, "PushDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");

		/* Clean stack */
		cleanGroupStack(m_gl);
	}

	/*
	 * PopDebugGroup function should generate:
	 * - STACK_UNDERFLOW when stack contains no entries.
	 */
	{
		fillGroupStack(m_gl);

		for (GLint i = 0; i < max_groups - 1; ++i)
		{
			m_gl->popDebugGroup();

			GLU_EXPECT_NO_ERROR(m_gl->getError(), "PopDebugGroup");
		}

		m_gl->popDebugGroup();
		CHECK_ERROR(GL_STACK_UNDERFLOW, "PopDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");
	}

	/*
	 * ObjectLabel function should generate:
	 * - INVALID_ENUM when <identifier> is invalid;
	 * - INVALID_VALUE when if <name> is not valid object name of type specified by
	 * <identifier>;
	 * - INVALID_VALUE when length of string <label> is not less than
	 * MAX_LABEL_LENGTH.
	 */
	{
		static const GLchar  label[] = "Foo";
		static const GLsizei length  = (GLsizei)(sizeof(label) / sizeof(label[0]));

		GLuint texture_id = 0;
		GLuint invalid_id = 1;
		m_gl->genTextures(1, &texture_id);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "GenTextures");

		try
		{
			m_gl->objectLabel(GL_TEXTURE_BUFFER /* identifier */, texture_id /* name */, length /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_ENUM, "ObjectLabel with <identifier> set to GL_TEXTURE_BUFFER");

			while (GL_TRUE == m_gl->isTexture(invalid_id))
			{
				invalid_id += 1;
			}

			m_gl->objectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, length /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with <name> set to not generated value");

			m_gl->objectLabel(GL_TEXTURE /* identifier */, texture_id /* name */, max_label + 1 /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with <label> set to MAX_LABEL_LENGTH + 1");

			m_gl->objectLabel(GL_TEXTURE /* identifier */, texture_id /* name */, -1 /* length */,
							  &too_long_label[0] /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with too long label");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteTextures(1, &texture_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteTextures(1, &texture_id);
	}

	/*
	 * GetObjectLabel function should generate:
	 * - INVALID_ENUM when <identifier> is invalid;
	 * - INVALID_VALUE when if <name> is not valid object name of type specified by
	 * <identifier>;
	 * - INVALID_VALUE when <bufSize> is negative.
	 */
	{
		static const GLsizei bufSize = 32;

		GLchar  label[bufSize];
		GLsizei length = 0;

		GLuint texture_id = 0;
		GLuint invalid_id = 1;
		m_gl->genTextures(1, &texture_id);
		m_gl->bindTexture(GL_TEXTURE_2D, texture_id);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "GenTextures");

		try
		{
			m_gl->getObjectLabel(GL_TEXTURE_BUFFER /* identifier */, texture_id /* name */, bufSize /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_ENUM, "GetObjectLabel with <identifier> set to GL_TEXTURE_BUFFER");

			while (GL_TRUE == m_gl->isTexture(invalid_id))
			{
				invalid_id += 1;
			}

			m_gl->getObjectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, bufSize /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectLabel with <name> set to not generated value");

			m_gl->getObjectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, -1 /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectLabel with <bufSize> set to -1");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteTextures(1, &texture_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteTextures(1, &texture_id);
	}

	/*
	 * ObjectPtrLabel function should generate:
	 * - INVALID_VALUE when <ptr> is not the name of sync object;
	 * - INVALID_VALUE when length of string <label> is not less than
	 * MAX_LABEL_LENGTH.
	 */
	{
		static const GLchar  label[] = "Foo";
		static const GLsizei length  = (GLsizei)(sizeof(label) / sizeof(label[0]));

		GLsync sync_id	= 0;
		GLsync invalid_id = 0;
		sync_id			  = m_gl->fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "FenceSync");

		try
		{
			while (GL_TRUE == m_gl->isSync(invalid_id))
			{
				invalid_id = (GLsync)(((unsigned long long)invalid_id) + 1);
			}

			m_gl->objectPtrLabel(invalid_id /* name */, length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with <ptr> set to not generated value");

			m_gl->objectPtrLabel(sync_id /* name */, max_label + 1 /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with <length> set to MAX_LABEL_LENGTH + 1");

			m_gl->objectPtrLabel(sync_id /* name */, -1 /* length */, &too_long_label[0] /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with too long label");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteSync(sync_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteSync(sync_id);
	}

	/*
	 * GetObjectPtrLabel function should generate:
	 * - INVALID_VALUE when <ptr> is not the name of sync object;
	 * - INVALID_VALUE when <bufSize> is negative.
	 */
	{
		static const GLsizei bufSize = 32;

		GLchar  label[bufSize];
		GLsizei length = 0;

		GLsync sync_id	= 0;
		GLsync invalid_id = 0;
		sync_id			  = m_gl->fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "FenceSync");

		try
		{
			while (GL_TRUE == m_gl->isSync(invalid_id))
			{
				invalid_id = (GLsync)(((unsigned long long)invalid_id) + 1);
			}

			m_gl->getObjectPtrLabel(invalid_id /* name */, bufSize /* bufSize */, &length /* length */,
									label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectPtrLabel with <ptr> set to not generated value");

			m_gl->getObjectPtrLabel(sync_id /* name */, -1 /* bufSize */, &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectPtrLabel with <bufSize> set to -1");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteSync(sync_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteSync(sync_id);
	}

	/*
	 * GetPointerv function should generate:
	 * - INVALID_ENUM when <pname> is invalid.
	 **/
	{
		GLuint  uint;
		GLuint* uint_ptr = &uint;

		m_gl->getPointerv(GL_ARRAY_BUFFER, (GLvoid**)&uint_ptr);
		CHECK_ERROR(GL_INVALID_ENUM, "GetPointerv with <pname> set to GL_ARRAY_BUFFER");
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	TestBase::done();

	return tcu::TestNode::STOP;
}